

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O0

Error __thiscall
miniros::master::ParameterStorage::setParam
          (ParameterStorage *this,string *caller_id,string *key,RpcValue *value)

{
  bool bVar1;
  ostream *poVar2;
  Type *pTVar3;
  undefined8 uVar4;
  XmlRpcValue *in_RCX;
  string *in_RDX;
  void *__buf;
  string *in_RSI;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar5;
  RpcValue *param;
  Path name;
  bool enabled_1;
  scoped_lock<std::mutex> m_lock;
  bool enabled;
  string fullKey;
  stringstream ss;
  Error err;
  char *in_stack_fffffffffffffbf8;
  Level LVar6;
  Path *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  LogLocation *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  XmlRpcValue *in_stack_fffffffffffffc38;
  void *pvVar7;
  undefined4 in_stack_fffffffffffffc40;
  Level LVar8;
  undefined4 in_stack_fffffffffffffc44;
  Path *in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffcc0;
  undefined1 create;
  Path *in_stack_fffffffffffffcc8;
  ParameterStorage *in_stack_fffffffffffffcd0;
  string local_2e0 [38];
  undefined1 local_2ba;
  allocator<char> local_2b9;
  string local_2b8 [16];
  RpcValue *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  ParameterStorage *in_stack_fffffffffffffd68;
  string local_278 [23];
  undefined1 in_stack_fffffffffffffd9f;
  string *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  string local_240 [4];
  string local_200 [32];
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  XmlRpcValue *local_28;
  string *local_20;
  string *local_18;
  Error local_4;
  
  LVar8 = (Level)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  create = (undefined1)((ulong)in_stack_fffffffffffffcc0 >> 0x38);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = ::std::operator<<(local_1a0,local_20);
  ::std::operator<<(poVar2,"=");
  XmlRpc::XmlRpcValue::write(local_28,(int)local_1a0,__buf,(size_t)in_RCX);
  poVar2 = ::std::operator<<(local_1a0," from ");
  ::std::operator<<(poVar2,local_18);
  names::resolve((string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffd9f);
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((setParam::loc.initialized_ ^ 0xffU) & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (char *)in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    ::std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
    ::std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
    console::initializeLogLocation
              ((LogLocation *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,LVar8);
    ::std::__cxx11::string::~string(local_200);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
    ::std::__cxx11::string::~string(local_240);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
  }
  if (setParam::loc.level_ != Info) {
    console::setLogLocationLevel
              ((LogLocation *)in_stack_fffffffffffffc00,
               (Level)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
    console::checkLogLocationEnabled(in_stack_fffffffffffffc10);
  }
  pvVar7 = setParam::loc.logger_;
  LVar6 = setParam::loc.level_;
  if ((setParam::loc.logger_enabled_ & 1U) != 0) {
    in_stack_fffffffffffffc00 = (Path *)::std::__cxx11::string::c_str();
    in_stack_fffffffffffffc08 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::__cxx11::string::c_str();
    in_stack_fffffffffffffc10 = (LogLocation *)::std::__cxx11::string::c_str();
    in_stack_fffffffffffffbf8 = "setParam(\"%s\") from \"%s\", key=\"%s\"";
    console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x97,
                   "Error miniros::master::ParameterStorage::setParam(const std::string &, const std::string &, const RpcValue &)"
                  );
  }
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffc00,
             (mutex_type *)in_stack_fffffffffffffbf8);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  LVar6 = (Level)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  if (bVar1) {
    pTVar3 = XmlRpc::XmlRpcValue::getType(local_28);
    if (*pTVar3 != TypeStruct) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
            ::loc.initialized_ ^ 0xffU) & 1) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (char *)in_stack_fffffffffffffc38,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30))
        ;
        ::std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
        ::std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
        console::initializeLogLocation
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   in_stack_fffffffffffffc28,LVar8);
        ::std::__cxx11::string::~string(local_278);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
        ::std::__cxx11::string::~string(local_2b8);
        ::std::allocator<char>::~allocator(&local_2b9);
      }
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.level_ != Error) {
        console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffc00,LVar6);
        console::checkLogLocationEnabled(in_stack_fffffffffffffc10);
      }
      local_2ba = (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                   ::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_2ba) {
        pvVar7 = setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                 ::loc.logger_;
        LVar8 = setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                ::loc.level_;
        ::std::__cxx11::stringstream::str();
        uVar4 = ::std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar7,(Level)(ulong)LVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                       ,0x9f,
                       "Error miniros::master::ParameterStorage::setParam(const std::string &, const std::string &, const RpcValue &)"
                       ,"setParam(\"%s\") - cannot set root of parameter tree to non-dictionary",
                       uVar4);
        ::std::__cxx11::string::~string(local_2e0);
      }
      Error::Error(&local_4,InvalidValue);
      goto LAB_00552bd2;
    }
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               in_stack_fffffffffffffc38);
    checkParamUpdates(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58)
    ;
  }
  else {
    names::Path::Path(in_stack_fffffffffffffc00);
    local_4 = names::Path::fromString
                        (in_stack_fffffffffffffc48,
                         (string *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    bVar1 = Error::operator_cast_to_bool(&local_4);
    if (bVar1) {
      pVar5 = findParameter(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(bool)create);
      if (pVar5.first == (XmlRpcValue *)0x0) {
        Error::Error(&local_4,ParameterNotFound);
        bVar1 = true;
      }
      else {
        XmlRpc::XmlRpcValue::operator=
                  ((XmlRpcValue *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   in_stack_fffffffffffffc38);
        checkParamUpdates(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                          in_stack_fffffffffffffd58);
        bVar1 = false;
      }
    }
    else {
      bVar1 = true;
    }
    names::Path::~Path(in_stack_fffffffffffffc00);
    if (bVar1) goto LAB_00552bd2;
  }
  Error::Error(&local_4,Ok);
LAB_00552bd2:
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x552bdf);
  ::std::__cxx11::string::~string(local_1e0);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return (Error)local_4.code;
}

Assistant:

Error ParameterStorage::setParam(const std::string& caller_id, const std::string& key, const RpcValue& value)
{
  std::stringstream ss;
  ss << key << "=";
  value.write(ss);
  ss << " from " << caller_id;

  std::string fullKey = miniros::names::resolve(caller_id, key, false);
  MINIROS_INFO_NAMED("rosparam", "setParam(\"%s\") from \"%s\", key=\"%s\"", fullKey.c_str(), caller_id.c_str(), key.c_str());
  std::scoped_lock<std::mutex> m_lock(m_parameterLock);

  if (fullKey == "/") {
    if (value.getType() == RpcValue::TypeStruct) {
      m_parameterRoot = value;
      checkParamUpdates(fullKey, &m_parameterRoot);
    } else {
      MINIROS_ERROR_NAMED("rosparam", "setParam(\"%s\") - cannot set root of parameter tree to non-dictionary", ss.str().c_str());
      return Error::InvalidValue;
    }
  } else {
    names::Path name;
    if (auto err = name.fromString(fullKey); !err)
      return err;
    RpcValue* param = findParameter(name, true).first;
    if (!param)
      return Error::ParameterNotFound;
    *param = value;
    checkParamUpdates(fullKey, param);
  }

  return Error::Ok;
}